

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chaiscript_eval.hpp
# Opt level: O0

Boxed_Value __thiscall
chaiscript::eval::
Dot_Access_AST_Node<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_>::eval_internal
          (Dot_Access_AST_Node<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_>
           *this,Dispatch_State *t_ss)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> *this_00;
  bool bVar1;
  const_reference pvVar2;
  pointer pAVar3;
  size_type sVar4;
  reference pvVar5;
  Dispatch_Engine *pDVar6;
  Dispatch_State *in_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  Boxed_Value BVar7;
  string_view t_name;
  dispatch_error *e_1;
  basic_string_view<char,_std::char_traits<char>_> local_1e8;
  undefined1 local_1d8 [24];
  undefined1 local_1c0 [8];
  array<chaiscript::Boxed_Value,_2UL> p;
  dispatch_error *e;
  Return_Value *rv;
  undefined1 local_b0 [32];
  undefined1 local_90 [24];
  unique_ptr<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_>,_std::default_delete<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_>_>_>
  *child;
  iterator __end0;
  iterator __begin0;
  vector<std::unique_ptr<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_>,_std::default_delete<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_>_>_>,_std::allocator<std::unique_ptr<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_>,_std::default_delete<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_>_>_>_>_>
  *__range4;
  undefined1 local_58 [7];
  bool has_function_params;
  vector<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_> params;
  Function_Push_Pop local_28;
  Function_Push_Pop fpp;
  Dispatch_State *t_ss_local;
  Dot_Access_AST_Node<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_> *this_local;
  Boxed_Value *retval;
  
  fpp.m_ds = in_RDX;
  detail::Function_Push_Pop::Function_Push_Pop(&local_28,in_RDX);
  pvVar2 = std::
           vector<std::unique_ptr<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_>,_std::default_delete<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_>_>_>,_std::allocator<std::unique_ptr<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_>,_std::default_delete<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_>_>_>_>_>
           ::operator[]((vector<std::unique_ptr<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_>,_std::default_delete<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_>_>_>,_std::allocator<std::unique_ptr<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_>,_std::default_delete<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_>_>_>_>_>
                         *)&t_ss[2].m_conversions,0);
  pAVar3 = std::
           unique_ptr<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_>,_std::default_delete<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_>_>_>
           ::operator->(pvVar2);
  BVar7 = AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_>::eval
                    (&this->
                      super_AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_>
                     ,(Dispatch_State *)pAVar3);
  make_vector<chaiscript::Boxed_Value&>
            ((vector<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_> *)local_58,
             (chaiscript *)this,
             (Boxed_Value *)
             BVar7.m_data.
             super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi);
  __range4._7_1_ = 0;
  pvVar2 = std::
           vector<std::unique_ptr<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_>,_std::default_delete<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_>_>_>,_std::allocator<std::unique_ptr<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_>,_std::default_delete<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_>_>_>_>_>
           ::operator[]((vector<std::unique_ptr<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_>,_std::default_delete<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_>_>_>,_std::allocator<std::unique_ptr<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_>,_std::default_delete<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_>_>_>_>_>
                         *)&t_ss[2].m_conversions,1);
  pAVar3 = std::
           unique_ptr<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_>,_std::default_delete<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_>_>_>
           ::operator->(pvVar2);
  sVar4 = std::
          vector<std::unique_ptr<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_>,_std::default_delete<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_>_>_>,_std::allocator<std::unique_ptr<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_>,_std::default_delete<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_>_>_>_>_>
          ::size(&pAVar3->children);
  if (1 < sVar4) {
    __range4._7_1_ = 1;
    pvVar2 = std::
             vector<std::unique_ptr<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_>,_std::default_delete<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_>_>_>,_std::allocator<std::unique_ptr<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_>,_std::default_delete<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_>_>_>_>_>
             ::operator[]((vector<std::unique_ptr<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_>,_std::default_delete<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_>_>_>,_std::allocator<std::unique_ptr<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_>,_std::default_delete<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_>_>_>_>_>
                           *)&t_ss[2].m_conversions,1);
    pAVar3 = std::
             unique_ptr<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_>,_std::default_delete<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_>_>_>
             ::operator->(pvVar2);
    pvVar5 = std::
             vector<std::unique_ptr<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_>,_std::default_delete<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_>_>_>,_std::allocator<std::unique_ptr<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_>,_std::default_delete<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_>_>_>_>_>
             ::operator[](&pAVar3->children,1);
    pAVar3 = std::
             unique_ptr<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_>,_std::default_delete<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_>_>_>
             ::operator->(pvVar5);
    __end0 = std::
             vector<std::unique_ptr<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_>,_std::default_delete<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_>_>_>,_std::allocator<std::unique_ptr<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_>,_std::default_delete<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_>_>_>_>_>
             ::begin(&pAVar3->children);
    child = (unique_ptr<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_>,_std::default_delete<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_>_>_>
             *)std::
               vector<std::unique_ptr<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_>,_std::default_delete<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_>_>_>,_std::allocator<std::unique_ptr<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_>,_std::default_delete<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_>_>_>_>_>
               ::end(&pAVar3->children);
    while (bVar1 = __gnu_cxx::
                   operator==<std::unique_ptr<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_>,_std::default_delete<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_>_>_>_*,_std::vector<std::unique_ptr<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_>,_std::default_delete<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_>_>_>,_std::allocator<std::unique_ptr<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_>,_std::default_delete<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_>_>_>_>_>_>
                             (&__end0,(__normal_iterator<std::unique_ptr<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_>,_std::default_delete<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_>_>_>_*,_std::vector<std::unique_ptr<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_>,_std::default_delete<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_>_>_>,_std::allocator<std::unique_ptr<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_>,_std::default_delete<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_>_>_>_>_>_>
                                       *)&child), ((bVar1 ^ 0xffU) & 1) != 0) {
      local_90._16_8_ =
           __gnu_cxx::
           __normal_iterator<std::unique_ptr<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_>,_std::default_delete<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_>_>_>_*,_std::vector<std::unique_ptr<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_>,_std::default_delete<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_>_>_>,_std::allocator<std::unique_ptr<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_>,_std::default_delete<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_>_>_>_>_>_>
           ::operator*(&__end0);
      pAVar3 = std::
               unique_ptr<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_>,_std::default_delete<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_>_>_>
               ::operator->((unique_ptr<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_>,_std::default_delete<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_>_>_>
                             *)local_90._16_8_);
      AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_>::eval
                ((AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_> *)
                 local_90,(Dispatch_State *)pAVar3);
      std::vector<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_>::push_back
                ((vector<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_> *)
                 local_58,(value_type *)local_90);
      Boxed_Value::~Boxed_Value((Boxed_Value *)local_90);
      __gnu_cxx::
      __normal_iterator<std::unique_ptr<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_>,_std::default_delete<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_>_>_>_*,_std::vector<std::unique_ptr<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_>,_std::default_delete<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_>_>_>,_std::allocator<std::unique_ptr<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_>,_std::default_delete<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_>_>_>_>_>_>
      ::operator++(&__end0);
    }
  }
  Function_Params::Function_Params
            ((Function_Params *)(local_b0 + 0x10),
             (vector<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_> *)local_58);
  detail::Function_Push_Pop::save_params(&local_28,(Function_Params *)(local_b0 + 0x10));
  pDVar6 = chaiscript::detail::Dispatch_State::operator->(fpp.m_ds);
  Function_Params::Function_Params
            ((Function_Params *)&rv,
             (vector<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_> *)local_58);
  chaiscript::detail::Dispatch_State::conversions(fpp.m_ds);
  chaiscript::detail::Dispatch_Engine::call_member
            ((Dispatch_Engine *)local_b0,(string *)pDVar6,
             (atomic_uint_fast32_t *)&t_ss[3].m_conversions.m_saves,
             (Function_Params *)&t_ss[3].m_stack_holder,SUB81(&rv,0),
             (Type_Conversions_State *)(ulong)__range4._7_1_);
  Boxed_Value::operator=((Boxed_Value *)this,(Boxed_Value *)local_b0);
  Boxed_Value::~Boxed_Value((Boxed_Value *)local_b0);
  pvVar2 = std::
           vector<std::unique_ptr<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_>,_std::default_delete<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_>_>_>,_std::allocator<std::unique_ptr<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_>,_std::default_delete<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_>_>_>_>_>
           ::operator[]((vector<std::unique_ptr<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_>,_std::default_delete<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_>_>_>,_std::allocator<std::unique_ptr<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_>,_std::default_delete<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_>_>_>_>_>
                         *)&t_ss[2].m_conversions,1);
  pAVar3 = std::
           unique_ptr<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_>,_std::default_delete<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_>_>_>
           ::operator->(pvVar2);
  if ((pAVar3->super_AST_Node).identifier == Array_Call) {
    local_1d8._16_8_ = local_1c0;
    Boxed_Value::Boxed_Value((Boxed_Value *)local_1d8._16_8_,(Boxed_Value *)this);
    this_00 = &p._M_elems[0].m_data.
               super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount;
    local_1d8._16_8_ = this_00;
    pvVar2 = std::
             vector<std::unique_ptr<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_>,_std::default_delete<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_>_>_>,_std::allocator<std::unique_ptr<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_>,_std::default_delete<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_>_>_>_>_>
             ::operator[]((vector<std::unique_ptr<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_>,_std::default_delete<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_>_>_>,_std::allocator<std::unique_ptr<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_>,_std::default_delete<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_>_>_>_>_>
                           *)&t_ss[2].m_conversions,1);
    pAVar3 = std::
             unique_ptr<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_>,_std::default_delete<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_>_>_>
             ::operator->(pvVar2);
    pvVar5 = std::
             vector<std::unique_ptr<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_>,_std::default_delete<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_>_>_>,_std::allocator<std::unique_ptr<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_>,_std::default_delete<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_>_>_>_>_>
             ::operator[](&pAVar3->children,1);
    pAVar3 = std::
             unique_ptr<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_>,_std::default_delete<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_>_>_>
             ::operator->(pvVar5);
    AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_>::eval
              ((AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_> *)
               this_00,(Dispatch_State *)pAVar3);
    pDVar6 = chaiscript::detail::Dispatch_State::operator->(fpp.m_ds);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_1e8,"[]");
    Function_Params::Function_Params<2ul>
              ((Function_Params *)&e_1,(array<chaiscript::Boxed_Value,_2UL> *)local_1c0);
    chaiscript::detail::Dispatch_State::conversions(fpp.m_ds);
    t_name._M_str = (char *)local_1e8._M_len;
    t_name._M_len = (size_t)pDVar6;
    chaiscript::detail::Dispatch_Engine::call_function
              ((Dispatch_Engine *)local_1d8,t_name,(atomic_uint_fast32_t *)local_1e8._M_str,
               (Function_Params *)&t_ss[3].m_conversions,(Type_Conversions_State *)&e_1);
    Boxed_Value::operator=((Boxed_Value *)this,(Boxed_Value *)local_1d8);
    Boxed_Value::~Boxed_Value((Boxed_Value *)local_1d8);
    std::array<chaiscript::Boxed_Value,_2UL>::~array
              ((array<chaiscript::Boxed_Value,_2UL> *)local_1c0);
  }
  std::vector<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_>::~vector
            ((vector<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_> *)local_58);
  detail::Function_Push_Pop::~Function_Push_Pop(&local_28);
  BVar7.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = extraout_RDX._M_pi;
  BVar7.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = (element_type *)this;
  return (Boxed_Value)
         BVar7.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

Boxed_Value eval_internal(const chaiscript::detail::Dispatch_State &t_ss) const override {
        chaiscript::eval::detail::Function_Push_Pop fpp(t_ss);

        Boxed_Value retval = this->children[0]->eval(t_ss);
        auto params = make_vector(retval);

        bool has_function_params = false;
        if (this->children[1]->children.size() > 1) {
          has_function_params = true;
          for (const auto &child : this->children[1]->children[1]->children) {
            params.push_back(child->eval(t_ss));
          }
        }

        fpp.save_params(Function_Params{params});

        try {
          retval = t_ss->call_member(m_fun_name, m_loc, Function_Params{params}, has_function_params, t_ss.conversions());
        } catch (const exception::dispatch_error &e) {
          if (e.functions.empty()) {
            throw exception::eval_error("'" + m_fun_name + "' is not a function.");
          } else {
            throw exception::eval_error(std::string(e.what()) + " for function '" + m_fun_name + "'", e.parameters, e.functions, true, *t_ss);
          }
        } catch (detail::Return_Value &rv) {
          retval = std::move(rv.retval);
        }

        if (this->children[1]->identifier == AST_Node_Type::Array_Call) {
          try {
            std::array<Boxed_Value, 2> p{retval, this->children[1]->children[1]->eval(t_ss)};
            retval = t_ss->call_function("[]", m_array_loc, Function_Params{p}, t_ss.conversions());
          } catch (const exception::dispatch_error &e) {
            throw exception::eval_error("Can not find appropriate array lookup operator '[]'.", e.parameters, e.functions, true, *t_ss);
          }
        }

        return retval;
      }